

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O3

void __thiscall HACD::TMMesh::Clear(TMMesh *this)

{
  CircularList<HACD::TMMVertex>::Clear(&this->m_vertices);
  CircularList<HACD::TMMEdge>::Clear(&this->m_edges);
  CircularList<HACD::TMMTriangle>::Clear(&this->m_triangles);
  return;
}

Assistant:

void TMMesh::Clear()
    {
		m_vertices.Clear();
		m_edges.Clear();
		m_triangles.Clear();
	}